

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp.c
# Opt level: O0

float fe_warp_warped_to_unwarped(melfb_t *mel,float nonlinear)

{
  float fVar1;
  float nonlinear_local;
  melfb_t *mel_local;
  
  if (mel->warp_id < 3) {
    fVar1 = (*fe_warp_conf[mel->warp_id].warped_to_unwarped)(nonlinear);
    return fVar1;
  }
  if (mel->warp_id == 0xffffffff) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_warp.c"
            ,0xd1,"fe_warp module must be configured w/ a valid ID\n");
    exit(1);
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_warp.c"
          ,0xd6,"fe_warp module misconfigured with invalid fe_warp_id %u\n",(ulong)mel->warp_id);
  exit(1);
}

Assistant:

float
fe_warp_warped_to_unwarped(melfb_t *mel, float nonlinear)
{
    if (mel->warp_id <= FE_WARP_ID_MAX) {
        return fe_warp_conf[mel->warp_id].warped_to_unwarped(nonlinear);
    }
    else if (mel->warp_id == FE_WARP_ID_NONE) {
        E_FATAL("fe_warp module must be configured w/ a valid ID\n");
    }
    else {
        E_FATAL
            ("fe_warp module misconfigured with invalid fe_warp_id %u\n",
             mel->warp_id);
    }

    return 0;
}